

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::DoSimdRelaxedNmadd<double>(Thread *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Simd<double,_(unsigned_char)__x02_> value;
  double *pdVar4;
  byte local_51;
  undefined1 auStack_50 [7];
  u8 i;
  SS result;
  Simd<double,_(unsigned_char)__x02_> a;
  Simd<double,_(unsigned_char)__x02_> b;
  Simd<double,_(unsigned_char)__x02_> c;
  Thread *this_local;
  
  join_0x00001240_0x00001200_ = Pop<wabt::interp::Simd<double,(unsigned_char)2>>(this);
  join_0x00001240_0x00001200_ = Pop<wabt::interp::Simd<double,(unsigned_char)2>>(this);
  join_0x00001240_0x00001200_ = Pop<wabt::interp::Simd<double,(unsigned_char)2>>(this);
  for (local_51 = 0; local_51 < 2; local_51 = local_51 + 1) {
    pdVar4 = Simd<double,_(unsigned_char)'\x02'>::operator[]
                       ((Simd<double,_(unsigned_char)__x02_> *)(result.v + 1),local_51);
    dVar1 = *pdVar4;
    pdVar4 = Simd<double,_(unsigned_char)'\x02'>::operator[]
                       ((Simd<double,_(unsigned_char)__x02_> *)(a.v + 1),local_51);
    dVar2 = *pdVar4;
    pdVar4 = Simd<double,_(unsigned_char)'\x02'>::operator[]
                       ((Simd<double,_(unsigned_char)__x02_> *)(b.v + 1),local_51);
    dVar3 = *pdVar4;
    pdVar4 = Simd<double,_(unsigned_char)'\x02'>::operator[]
                       ((Simd<double,_(unsigned_char)__x02_> *)auStack_50,local_51);
    *pdVar4 = -dVar1 * dVar2 + dVar3;
  }
  value.v[1] = result.v[0];
  value.v[0] = _auStack_50;
  Push<wabt::interp::Simd<double,(unsigned_char)2>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdRelaxedNmadd() {
  using SS = typename Simd128<S>::Type;
  auto c = Pop<SS>();
  auto b = Pop<SS>();
  auto a = Pop<SS>();
  SS result;
  for (u8 i = 0; i < SS::lanes; ++i) {
    result[i] = -(a[i] * b[i]) + c[i];
  }
  Push(result);
  return RunResult::Ok;
}